

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void P_CollectACSGlobalStrings(void)

{
  byte *pbVar1;
  uint uVar2;
  PoolEntry *pPVar3;
  uint uVar4;
  FACSStack *pFVar5;
  ulong uVar6;
  uint uVar7;
  
  for (pFVar5 = FACSStack::head; uVar4 = GlobalACSStrings.Pool.Count,
      pPVar3 = GlobalACSStrings.Pool.Array, pFVar5 != (FACSStack *)0x0; pFVar5 = pFVar5->next) {
    uVar2 = pFVar5->sp;
    if ((ulong)uVar2 != 0) {
      uVar6 = 0;
      do {
        if (((pFVar5->buffer[uVar6] & 0xfff00000U) == 0x7ff00000) &&
           (uVar7 = pFVar5->buffer[uVar6] & 0xfffff, uVar7 < uVar4)) {
          pbVar1 = (byte *)((long)&pPVar3[uVar7].LockCount + 3);
          *pbVar1 = *pbVar1 | 0x80;
        }
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  FBehavior::StaticMarkLevelVarStrings();
  P_MarkWorldVarStrings();
  P_MarkGlobalVarStrings();
  ACSStringPool::PurgeStrings(&GlobalACSStrings);
  return;
}

Assistant:

void P_CollectACSGlobalStrings()
{
	for (FACSStack *stack = FACSStack::head; stack != NULL; stack = stack->next)
	{
		GlobalACSStrings.MarkStringArray(stack->buffer, stack->sp);
	}
	FBehavior::StaticMarkLevelVarStrings();
	P_MarkWorldVarStrings();
	P_MarkGlobalVarStrings();
	GlobalACSStrings.PurgeStrings();
}